

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O2

bool __thiscall RealDiskInterface::MakeDir(RealDiskInterface *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  bool bVar5;
  
  iVar2 = mkdir((path->_M_dataplus)._M_p,0x1ff);
  bVar5 = true;
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      pcVar1 = (path->_M_dataplus)._M_p;
      pcVar4 = strerror(*piVar3);
      bVar5 = false;
      Error("mkdir(%s): %s",pcVar1,pcVar4);
    }
  }
  return bVar5;
}

Assistant:

bool RealDiskInterface::MakeDir(const string& path) {
  if (::MakeDir(path) < 0) {
    if (errno == EEXIST) {
      return true;
    }
    Error("mkdir(%s): %s", path.c_str(), strerror(errno));
    return false;
  }
  return true;
}